

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

void __thiscall QPDFLogger::Members::~Members(Members *this)

{
  element_type *peVar1;
  Members *this_local;
  
  peVar1 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->p_stdout);
  (*peVar1->_vptr_Pipeline[3])();
  peVar1 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->p_stderr);
  (*peVar1->_vptr_Pipeline[3])();
  std::shared_ptr<Pipeline>::~shared_ptr(&this->p_save);
  std::shared_ptr<Pipeline>::~shared_ptr(&this->p_error);
  std::shared_ptr<Pipeline>::~shared_ptr(&this->p_warn);
  std::shared_ptr<Pipeline>::~shared_ptr(&this->p_info);
  std::shared_ptr<Pipeline>::~shared_ptr(&this->p_stderr);
  std::shared_ptr<Pipeline>::~shared_ptr(&this->p_stdout);
  std::shared_ptr<Pipeline>::~shared_ptr(&this->p_real_stdout);
  std::shared_ptr<Pipeline>::~shared_ptr(&this->p_discard);
  return;
}

Assistant:

QPDFLogger::Members::~Members()
{
    p_stdout->finish();
    p_stderr->finish();
}